

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_integer_constant_expression
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  byte bVar1;
  GLSLVersion GVar2;
  String local_70;
  String local_40;
  byte local_19;
  LayoutBindingBaseCase *pLStack_18;
  bool passed;
  LayoutBindingBaseCase *this_local;
  
  local_19 = 1;
  pLStack_18 = this;
  this_local = (LayoutBindingBaseCase *)__return_storage_ptr__;
  GVar2 = getGLSLVersion(this);
  bVar1 = local_19;
  if (GVar2 == GLSL_VERSION_310_ES) {
    std::__cxx11::string::string((string *)&local_40);
    LayoutBindingTestResult::LayoutBindingTestResult
              (__return_storage_ptr__,(bool)(bVar1 & 1),&local_40,true);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::__cxx11::string::string((string *)&local_70);
    LayoutBindingTestResult::LayoutBindingTestResult
              (__return_storage_ptr__,(bool)(bVar1 & 1),&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_integer_constant_expression()
{
	bool passed = true;
	if (getGLSLVersion() == glu::GLSL_VERSION_310_ES)
		return LayoutBindingTestResult(passed, String(), true);

	return LayoutBindingTestResult(passed, String(), true);
}